

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int sync_update(sync_device *d,int row,sync_cb *cb,void *cb_param)

{
  code *pcVar1;
  void *pvVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t local_40;
  undefined1 local_39;
  uint32_t nrow;
  undefined1 local_32;
  uchar cmd_1;
  uint32_t new_row;
  uchar flag;
  uchar cmd;
  void *cb_param_local;
  sync_cb *cb_local;
  sync_device *psStack_18;
  int row_local;
  sync_device *d_local;
  
  _new_row = cb_param;
  cb_param_local = cb;
  cb_local._4_4_ = row;
  psStack_18 = d;
  if (d->sock != -1) {
LAB_0022aaef:
    do {
      iVar3 = socket_poll(psStack_18->sock);
      if (iVar3 == 0) {
        if ((((cb_param_local != (void *)0x0) && (*(long *)((long)cb_param_local + 0x10) != 0)) &&
            (iVar3 = (**(code **)((long)cb_param_local + 0x10))(_new_row), iVar3 != 0)) &&
           ((psStack_18->row != cb_local._4_4_ && (psStack_18->sock != -1)))) {
          local_39 = 3;
          local_40 = htonl(cb_local._4_4_);
          iVar3 = xsend(psStack_18->sock,&local_39,1,0);
          if ((iVar3 != 0) || (iVar3 = xsend(psStack_18->sock,&local_40,4,0), iVar3 != 0)) break;
          psStack_18->row = cb_local._4_4_;
        }
        return 0;
      }
      cmd_1 = '\0';
      iVar3 = xrecv(psStack_18->sock,&cmd_1,1,0);
      if (iVar3 != 0) break;
      switch(cmd_1) {
      case '\0':
        iVar3 = handle_set_key_cmd(psStack_18->sock,psStack_18);
        break;
      case '\x01':
        iVar3 = handle_del_key_cmd(psStack_18->sock,psStack_18);
        break;
      default:
        fprintf(_stderr,"unknown cmd: %02x\n",(ulong)cmd_1);
        goto LAB_0022acfd;
      case '\x03':
        iVar3 = xrecv(psStack_18->sock,&nrow,4,0);
        pvVar2 = _new_row;
        if (iVar3 != 0) goto LAB_0022acfd;
        if ((cb_param_local != (void *)0x0) && (*(long *)((long)cb_param_local + 8) != 0)) {
          pcVar1 = *(code **)((long)cb_param_local + 8);
          uVar4 = ntohl(nrow);
          (*pcVar1)(pvVar2,uVar4);
        }
        goto LAB_0022aaef;
      case '\x04':
        iVar3 = xrecv(psStack_18->sock,&local_32,1,0);
        if (iVar3 != 0) goto LAB_0022acfd;
        if ((cb_param_local != (void *)0x0) && (*cb_param_local != 0)) {
          (**cb_param_local)(_new_row,local_32);
        }
        goto LAB_0022aaef;
      case '\x05':
        sync_save_tracks(psStack_18);
        goto LAB_0022aaef;
      }
    } while (iVar3 == 0);
LAB_0022acfd:
    close(psStack_18->sock);
    psStack_18->sock = -1;
  }
  return -1;
}

Assistant:

int sync_update(struct sync_device *d, int row, struct sync_cb *cb,
    void *cb_param)
{
	if (d->sock == INVALID_SOCKET)
		return -1;

	/* look for new commands */
	while (socket_poll(d->sock)) {
		unsigned char cmd = 0, flag;
		uint32_t new_row;
		if (xrecv(d->sock, (char *)&cmd, 1, 0))
			goto sockerr;

		switch (cmd) {
		case SET_KEY:
			if (handle_set_key_cmd(d->sock, d))
				goto sockerr;
			break;
		case DELETE_KEY:
			if (handle_del_key_cmd(d->sock, d))
				goto sockerr;
			break;
		case SET_ROW:
			if (xrecv(d->sock, (char *)&new_row, sizeof(new_row), 0))
				goto sockerr;
			if (cb && cb->set_row)
				cb->set_row(cb_param, ntohl(new_row));
			break;
		case PAUSE:
			if (xrecv(d->sock, (char *)&flag, 1, 0))
				goto sockerr;
			if (cb && cb->pause)
				cb->pause(cb_param, flag);
			break;
		case SAVE_TRACKS:
			sync_save_tracks(d);
			break;
		default:
			fprintf(stderr, "unknown cmd: %02x\n", cmd);
			goto sockerr;
		}
	}

	if (cb && cb->is_playing && cb->is_playing(cb_param)) {
		if (d->row != row && d->sock != INVALID_SOCKET) {
			unsigned char cmd = SET_ROW;
			uint32_t nrow = htonl(row);
			if (xsend(d->sock, (char*)&cmd, 1, 0) ||
			    xsend(d->sock, (char*)&nrow, sizeof(nrow), 0))
				goto sockerr;
			d->row = row;
		}
	}
	return 0;

sockerr:
	closesocket(d->sock);
	d->sock = INVALID_SOCKET;
	return -1;
}